

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O1

int png_xy_from_XYZ(png_xy *xy,png_XYZ *XYZ)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  double dVar10;
  
  iVar5 = XYZ->red_X;
  iVar6 = 1;
  iVar7 = XYZ->red_Y + iVar5 + XYZ->red_Z;
  if (iVar7 != 0) {
    if (iVar5 == 0) {
      iVar5 = 0;
    }
    else {
      dVar10 = floor(((double)iVar5 * 100000.0) / (double)iVar7 + 0.5);
      if (2147483647.0 < dVar10) {
        return 1;
      }
      if (dVar10 < -2147483648.0) {
        return 1;
      }
      iVar5 = (int)dVar10;
    }
    xy->redx = iVar5;
    if (iVar7 != 0) {
      if (XYZ->red_Y == 0) {
        iVar5 = 0;
      }
      else {
        dVar10 = floor(((double)XYZ->red_Y * 100000.0) / (double)iVar7 + 0.5);
        if (2147483647.0 < dVar10) {
          return 1;
        }
        if (dVar10 < -2147483648.0) {
          return 1;
        }
        iVar5 = (int)dVar10;
      }
      xy->redy = iVar5;
      iVar5 = XYZ->green_X;
      iVar8 = XYZ->green_Y + iVar5 + XYZ->green_Z;
      if (iVar8 != 0) {
        iVar1 = XYZ->red_X;
        iVar2 = XYZ->red_Y;
        if (iVar5 == 0) {
          iVar5 = 0;
        }
        else {
          dVar10 = floor(((double)iVar5 * 100000.0) / (double)iVar8 + 0.5);
          if (2147483647.0 < dVar10) {
            return 1;
          }
          if (dVar10 < -2147483648.0) {
            return 1;
          }
          iVar5 = (int)dVar10;
        }
        xy->greenx = iVar5;
        if (iVar8 != 0) {
          if (XYZ->green_Y == 0) {
            iVar5 = 0;
          }
          else {
            dVar10 = floor(((double)XYZ->green_Y * 100000.0) / (double)iVar8 + 0.5);
            if (2147483647.0 < dVar10) {
              return 1;
            }
            if (dVar10 < -2147483648.0) {
              return 1;
            }
            iVar5 = (int)dVar10;
          }
          xy->greeny = iVar5;
          iVar5 = XYZ->blue_X;
          iVar9 = XYZ->blue_Y + iVar5 + XYZ->blue_Z;
          if (iVar9 != 0) {
            iVar3 = XYZ->green_X;
            iVar4 = XYZ->green_Y;
            if (iVar5 == 0) {
              iVar5 = 0;
            }
            else {
              dVar10 = floor(((double)iVar5 * 100000.0) / (double)iVar9 + 0.5);
              if (2147483647.0 < dVar10) {
                return 1;
              }
              if (dVar10 < -2147483648.0) {
                return 1;
              }
              iVar5 = (int)dVar10;
            }
            xy->bluex = iVar5;
            if (iVar9 != 0) {
              if (XYZ->blue_Y == 0) {
                iVar5 = 0;
              }
              else {
                dVar10 = floor(((double)XYZ->blue_Y * 100000.0) / (double)iVar9 + 0.5);
                if (2147483647.0 < dVar10) {
                  return 1;
                }
                if (dVar10 < -2147483648.0) {
                  return 1;
                }
                iVar5 = (int)dVar10;
              }
              xy->bluey = iVar5;
              iVar9 = iVar8 + iVar7 + iVar9;
              if (iVar9 != 0) {
                iVar5 = XYZ->blue_Y;
                iVar7 = iVar1 + iVar3 + XYZ->blue_X;
                if (iVar7 == 0) {
                  iVar7 = 0;
                }
                else {
                  dVar10 = floor(((double)iVar7 * 100000.0) / (double)iVar9 + 0.5);
                  if (2147483647.0 < dVar10) {
                    return 1;
                  }
                  if (dVar10 < -2147483648.0) {
                    return 1;
                  }
                  iVar7 = (int)dVar10;
                }
                xy->whitex = iVar7;
                if (iVar9 != 0) {
                  iVar6 = 0;
                  iVar5 = iVar2 + iVar4 + iVar5;
                  if (iVar5 != 0) {
                    dVar10 = floor(((double)iVar5 * 100000.0) / (double)iVar9 + 0.5);
                    if (2147483647.0 < dVar10) {
                      return 1;
                    }
                    if (dVar10 < -2147483648.0) {
                      return 1;
                    }
                    iVar6 = (int)dVar10;
                  }
                  xy->whitey = iVar6;
                  iVar6 = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

static int
png_xy_from_XYZ(png_xy *xy, const png_XYZ *XYZ)
{
   png_int_32 d, dwhite, whiteX, whiteY;

   d = XYZ->red_X + XYZ->red_Y + XYZ->red_Z;
   if (png_muldiv(&xy->redx, XYZ->red_X, PNG_FP_1, d) == 0)
      return 1;
   if (png_muldiv(&xy->redy, XYZ->red_Y, PNG_FP_1, d) == 0)
      return 1;
   dwhite = d;
   whiteX = XYZ->red_X;
   whiteY = XYZ->red_Y;

   d = XYZ->green_X + XYZ->green_Y + XYZ->green_Z;
   if (png_muldiv(&xy->greenx, XYZ->green_X, PNG_FP_1, d) == 0)
      return 1;
   if (png_muldiv(&xy->greeny, XYZ->green_Y, PNG_FP_1, d) == 0)
      return 1;
   dwhite += d;
   whiteX += XYZ->green_X;
   whiteY += XYZ->green_Y;

   d = XYZ->blue_X + XYZ->blue_Y + XYZ->blue_Z;
   if (png_muldiv(&xy->bluex, XYZ->blue_X, PNG_FP_1, d) == 0)
      return 1;
   if (png_muldiv(&xy->bluey, XYZ->blue_Y, PNG_FP_1, d) == 0)
      return 1;
   dwhite += d;
   whiteX += XYZ->blue_X;
   whiteY += XYZ->blue_Y;

   /* The reference white is simply the sum of the end-point (X,Y,Z) vectors,
    * thus:
    */
   if (png_muldiv(&xy->whitex, whiteX, PNG_FP_1, dwhite) == 0)
      return 1;
   if (png_muldiv(&xy->whitey, whiteY, PNG_FP_1, dwhite) == 0)
      return 1;

   return 0;
}